

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_vec2 rf_get_world_to_screen(rf_sizei screen_size,rf_vec3 position,rf_camera3d camera)

{
  rf_vec2 rVar1;
  double dVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  rf_mat mat_view;
  float local_58;
  float fStack_54;
  rf_mat local_48;
  
  fVar5 = position.z;
  fVar11 = 0.0;
  fVar10 = 1.0;
  fVar3 = (float)screen_size.width;
  fVar6 = (float)screen_size.height;
  if (camera.type == RF_CAMERA_ORTHOGRAPHIC) {
    fVar9 = camera.fovy * 0.5;
    fVar4 = (fVar3 / fVar6) * fVar9;
    fVar15 = 2.0 / (fVar4 + fVar4);
    fVar14 = 2.0 / (fVar9 + fVar9);
    fVar12 = -(fVar4 - fVar4) / (fVar4 + fVar4);
    fVar13 = -(fVar9 - fVar9) / (fVar9 + fVar9);
    fVar9 = 0.0;
    fVar4 = 0.0;
  }
  else {
    fVar15 = 1.0;
    fVar12 = 0.0;
    fVar14 = 1.0;
    fVar9 = 0.0;
    fVar13 = 0.0;
    fVar4 = 0.0;
    fVar11 = 0.0;
    if (camera.type == RF_CAMERA_PERSPECTIVE) {
      dVar2 = tan((double)(camera.fovy * 0.017453292) * 0.5);
      dVar2 = dVar2 * 0.01;
      dVar8 = ((double)screen_size.width / (double)screen_size.height) * dVar2;
      fVar15 = 0.02 / (float)(dVar8 + dVar8);
      fVar14 = 0.02 / (float)(dVar2 + dVar2);
      fVar11 = ((float)dVar8 - (float)dVar8) / (float)(dVar8 + dVar8);
      fVar9 = ((float)dVar2 - (float)dVar2) / (float)(dVar2 + dVar2);
      fVar4 = -1.0;
      fVar12 = 0.0;
      fVar13 = 0.0;
      fVar10 = 0.0;
    }
  }
  rf_mat_look_at(&local_48,camera.position,camera.target,camera.up);
  local_58 = position.x;
  fStack_54 = position.y;
  local_48.m12 = local_48.m8 * fVar5 + local_48.m0 * local_58 + local_48.m4 * fStack_54 +
                 local_48.m12;
  local_48.m13 = local_48.m9 * fVar5 + local_48.m1 * local_58 + local_48.m5 * fStack_54 +
                 local_48.m13;
  local_48.m14 = local_48.m10 * fVar5 + local_48.m2 * local_58 + local_48.m6 * fStack_54 +
                 local_48.m14;
  fVar7 = local_48.m13 * 0.0;
  local_48.m15 = fVar5 * local_48.m11 + local_48.m3 * local_58 + fStack_54 * local_48.m7 +
                 local_48.m15;
  fVar5 = local_48.m12 * 0.0;
  fVar10 = local_48.m15 * fVar10 + local_48.m14 * fVar4 + fVar5 + fVar7;
  rVar1.y = (1.0 - (fVar13 * local_48.m15 + fVar9 * local_48.m14 + fVar14 * local_48.m13 + fVar5) /
                   fVar10) * 0.5 * fVar6;
  rVar1.x = ((fVar12 * local_48.m15 + fVar11 * local_48.m14 + fVar15 * local_48.m12 + fVar7) /
             fVar10 + 1.0) * 0.5 * fVar3;
  return rVar1;
}

Assistant:

RF_API rf_vec2 rf_get_world_to_screen(rf_sizei screen_size, rf_vec3 position, rf_camera3d camera)
{
    // Calculate projection matrix from perspective instead of frustum
    rf_mat mat_proj = rf_mat_identity();

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        // Calculate projection matrix from perspective
        mat_proj = rf_mat_perspective(camera.fovy * RF_DEG2RAD, ((double) screen_size.width / (double) screen_size.height), 0.01, 1000.0);
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        float aspect = (float) screen_size.width / (float) screen_size.height;
        double top = camera.fovy / 2.0;
        double right = top * aspect;

    // Calculate projection matrix from orthographic
        mat_proj = rf_mat_ortho(-right, right, -top, top, 0.01, 1000.0);
    }

    // Calculate view matrix from camera look at (and transpose it)
    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);

    // Convert world position vector to quaternion
    rf_quaternion world_pos = { position.x, position.y, position.z, 1.0f };

    // Transform world position to view
    world_pos = rf_quaternion_transform(world_pos, mat_view);

    // Transform result to projection (clip space position)
    world_pos = rf_quaternion_transform(world_pos, mat_proj);

    // Calculate normalized device coordinates (inverted y)
    rf_vec3 ndc_pos = {world_pos.x / world_pos.w, -world_pos.y / world_pos.w, world_pos.z / world_pos.w};

    // Calculate 2d screen position vector
    rf_vec2 screen_position = {(ndc_pos.x + 1.0f) / 2.0f * (float) screen_size.width,
                               (ndc_pos.y + 1.0f) / 2.0f * (float) screen_size.height};

    return screen_position;
}